

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_star_simplex_iterators.h
# Opt level: O3

void __thiscall
Gudhi::
Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
::increment(Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
            *this)

{
  list_node<void_*> *plVar1;
  long lVar2;
  
  (this->it_).super_type.m_iterator.members_.nodeptr_ =
       ((this->it_).super_type.m_iterator.members_.nodeptr_)->next_;
  boost::iterators::
  filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
  ::satisfy_predicate(&this->it_);
  plVar1 = (this->it_).super_type.m_iterator.members_.nodeptr_;
  if (plVar1 == (this->end_).super_type.m_iterator.members_.nodeptr_) {
    lVar2 = 0x60;
    plVar1 = (list_node<void_*> *)0x0;
  }
  else {
    if (plVar1[1].next_[2].next_ == (node_ptr)0x0) {
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const short, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const short, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>>>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                   );
    }
    plVar1 = plVar1 + -4;
    lVar2 = 0x148;
  }
  *(list_node<void_*> **)((long)&(this->predicate_).cpx_ + lVar2) = plVar1;
  return;
}

Assistant:

void increment() {
    if (++it_ == end_) {
      st_ = nullptr;
    }       //== end
    else {  // update sh_
      const Node& curr_node = static_cast<const Node&>(*it_);
      sh_ = st_->simplex_handle_from_node(curr_node);
    }
  }